

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O2

int jpc_ns_synthesize(jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride)

{
  long lVar1;
  long *plVar2;
  jpc_fix_t *pjVar3;
  jpc_fix_t *pjVar4;
  int iVar5;
  ulong uVar6;
  long *plVar7;
  jpc_fix_t *pjVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  jpc_fix_t *pjVar12;
  jpc_fix_t *pjVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  jpc_fix_t *pjVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  jpc_fix_t *pjVar21;
  uint parity;
  jpc_fix_t *pjVar22;
  bool bVar23;
  uint llen;
  uint local_a8;
  jpc_fix_t *local_70;
  uint local_60;
  
  uVar16 = xstart & 1;
  uVar14 = (uVar16 ^ 1) + width >> 1;
  uVar11 = (ulong)uVar14;
  local_70._0_4_ = width & 1;
  bVar23 = (width & 1U) == uVar16;
  iVar15 = ((width - uVar14) - uVar16) - (uint)bVar23;
  pjVar13 = a + uVar11;
  local_60 = xstart & 1;
  iVar20 = (!bVar23 - uVar14) + (uint)(uVar16 == 0);
  pjVar22 = a;
  for (iVar5 = 0; iVar5 != height; iVar5 = iVar5 + 1) {
    if (1 < (uint)width) {
      for (lVar1 = 0; uVar14 != (uint)lVar1; lVar1 = lVar1 + 1) {
        pjVar22[lVar1] = pjVar22[lVar1] * 0x275d >> 0xd;
      }
      plVar2 = pjVar22 + uVar11;
      for (uVar6 = uVar11; width != (int)uVar6; uVar6 = uVar6 + 1) {
        pjVar22[uVar6] = pjVar22[uVar6] * 0x3406 >> 0xd;
      }
      pjVar4 = pjVar22;
      if (local_60 == 0) {
        *pjVar22 = *pjVar22 - (*plVar2 * 0x1c62 >> 0xd);
        pjVar4 = pjVar22 + 1;
      }
      for (lVar1 = 0; iVar20 + (int)lVar1 != 0; lVar1 = lVar1 + 1) {
        pjVar4[lVar1] = pjVar4[lVar1] - ((pjVar13[lVar1 + 1] + pjVar13[lVar1]) * 0xe31 >> 0xd);
      }
      if ((uint)local_70 != local_60) {
        pjVar4[lVar1] = pjVar4[lVar1] - (pjVar13[lVar1] * 0x1c62 >> 0xd);
      }
      plVar7 = plVar2;
      if (local_60 != 0) {
        *plVar2 = *plVar2 - (*pjVar22 * 0x3881 >> 0xd);
        plVar7 = plVar2 + 1;
      }
      for (lVar1 = 0; iVar15 != (int)lVar1; lVar1 = lVar1 + 1) {
        plVar7[lVar1] = plVar7[lVar1] - ((pjVar22[lVar1 + 1] + pjVar22[lVar1]) * 0x1c40 >> 0xd);
      }
      if ((uint)local_70 == local_60) {
        plVar7[lVar1] = plVar7[lVar1] - (pjVar22[lVar1] * 0x3881 >> 0xd);
      }
      pjVar4 = pjVar22;
      if (local_60 == 0) {
        *pjVar22 = *pjVar22 - (*plVar2 * -0x364 >> 0xd);
        pjVar4 = pjVar22 + 1;
      }
      for (lVar1 = 0; iVar20 + (int)lVar1 != 0; lVar1 = lVar1 + 1) {
        pjVar4[lVar1] = pjVar4[lVar1] - ((pjVar13[lVar1 + 1] + pjVar13[lVar1]) * -0x1b2 >> 0xd);
      }
      if ((uint)local_70 != local_60) {
        pjVar4[lVar1] = pjVar4[lVar1] - (pjVar13[lVar1] * -0x364 >> 0xd);
      }
      if (local_60 != 0) {
        *plVar2 = *plVar2 - (*pjVar22 * -0x6583 >> 0xd);
        plVar2 = plVar2 + 1;
      }
      for (lVar1 = 0; iVar15 != (int)lVar1; lVar1 = lVar1 + 1) {
        plVar2[lVar1] = plVar2[lVar1] - ((pjVar22[lVar1 + 1] + pjVar22[lVar1]) * -0x32c1 >> 0xd);
      }
      if ((uint)local_70 == local_60) {
        plVar2[lVar1] = plVar2[lVar1] - (pjVar22[lVar1] * -0x6583 >> 0xd);
      }
    }
    jpc_qmfb_join_row(pjVar22,width,local_60);
    pjVar22 = pjVar22 + stride;
    pjVar13 = pjVar13 + stride;
  }
  uVar16 = ystart & 1;
  uVar18 = (height - uVar16) + 1 >> 1;
  uVar6 = (ulong)(uVar18 * stride);
  uVar9 = (uint)((ystart & 1U) == 0);
  local_a8 = height & 1;
  bVar23 = (height & 1U) == uVar16;
  uVar14 = (uint)bVar23;
  uVar19 = (uint)!bVar23;
  iVar5 = (uVar18 - uVar9) - uVar19;
  iVar15 = ((height - uVar18) - uVar16) - uVar14;
  uVar11 = (ulong)((((byte)((char)ystart + 1) & 1) + height >> 1) * stride);
  pjVar13 = a + uVar11;
  pjVar21 = a + (uint)stride + uVar11;
  pjVar4 = a + (uint)stride + uVar6;
  pjVar22 = a + (uint)stride;
  local_70 = a + uVar6;
  for (uVar16 = 0; parity = ystart & 1, uVar16 < (width & 0xfffffff0U); uVar16 = uVar16 + 0x10) {
    pjVar3 = a;
    uVar10 = uVar18;
    if (1 < (uint)height) {
      while (uVar10 != 0) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          pjVar3[lVar1] = pjVar3[lVar1] * 0x275d >> 0xd;
        }
        pjVar3 = pjVar3 + (uint)stride;
        uVar10 = uVar10 - 1;
      }
      pjVar3 = a + uVar6;
      pjVar8 = local_70;
      iVar20 = height - uVar18;
      while (bVar23 = iVar20 != 0, iVar20 = iVar20 + -1, bVar23) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          pjVar8[lVar1] = pjVar8[lVar1] * 0x3406 >> 0xd;
        }
        pjVar8 = pjVar8 + (uint)stride;
      }
      pjVar8 = a;
      pjVar12 = local_70;
      pjVar17 = pjVar4;
      iVar20 = iVar5;
      if (parity == 0) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          a[lVar1] = a[lVar1] - (a[uVar6 + lVar1] * 0x1c62 >> 0xd);
        }
        pjVar8 = a + (uint)stride;
      }
      while (iVar20 != 0) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          pjVar8[lVar1] = pjVar8[lVar1] - ((pjVar17[lVar1] + pjVar12[lVar1]) * 0xe31 >> 0xd);
        }
        pjVar8 = pjVar8 + (uint)stride;
        pjVar12 = pjVar12 + (uint)stride;
        pjVar17 = pjVar17 + (uint)stride;
        iVar20 = iVar20 + -1;
      }
      if (local_a8 != parity) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          pjVar8[lVar1] = pjVar8[lVar1] - (pjVar12[lVar1] * 0x1c62 >> 0xd);
        }
      }
      pjVar8 = pjVar3;
      pjVar12 = a;
      pjVar17 = pjVar22;
      iVar20 = iVar15;
      if (parity != 0) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          a[uVar6 + lVar1] = a[uVar6 + lVar1] - (a[lVar1] * 0x3881 >> 0xd);
        }
        pjVar8 = pjVar3 + (uint)stride;
      }
      while (iVar20 != 0) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          pjVar8[lVar1] = pjVar8[lVar1] - ((pjVar17[lVar1] + pjVar12[lVar1]) * 0x1c40 >> 0xd);
        }
        pjVar8 = pjVar8 + (uint)stride;
        pjVar12 = pjVar12 + (uint)stride;
        pjVar17 = pjVar17 + (uint)stride;
        iVar20 = iVar20 + -1;
      }
      if (local_a8 == parity) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          pjVar8[lVar1] = pjVar8[lVar1] - (pjVar12[lVar1] * 0x3881 >> 0xd);
        }
      }
      pjVar8 = a;
      pjVar12 = local_70;
      pjVar17 = pjVar4;
      iVar20 = iVar5;
      if (parity == 0) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          a[lVar1] = a[lVar1] - (a[uVar6 + lVar1] * -0x364 >> 0xd);
        }
        pjVar8 = a + (uint)stride;
      }
      while (iVar20 != 0) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          pjVar8[lVar1] = pjVar8[lVar1] - ((pjVar17[lVar1] + pjVar12[lVar1]) * -0x1b2 >> 0xd);
        }
        pjVar8 = pjVar8 + (uint)stride;
        pjVar12 = pjVar12 + (uint)stride;
        pjVar17 = pjVar17 + (uint)stride;
        iVar20 = iVar20 + -1;
      }
      if (local_a8 != parity) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          pjVar8[lVar1] = pjVar8[lVar1] - (pjVar12[lVar1] * -0x364 >> 0xd);
        }
      }
      pjVar8 = a;
      pjVar12 = pjVar22;
      iVar20 = iVar15;
      if (parity != 0) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          a[uVar6 + lVar1] = a[uVar6 + lVar1] - (a[lVar1] * -0x6583 >> 0xd);
        }
        pjVar3 = pjVar3 + (uint)stride;
      }
      while (iVar20 != 0) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          pjVar3[lVar1] = pjVar3[lVar1] - ((pjVar12[lVar1] + pjVar8[lVar1]) * -0x32c1 >> 0xd);
        }
        pjVar3 = pjVar3 + (uint)stride;
        pjVar8 = pjVar8 + (uint)stride;
        pjVar12 = pjVar12 + (uint)stride;
        iVar20 = iVar20 + -1;
      }
      if (local_a8 == parity) {
        for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 1) {
          pjVar3[lVar1] = pjVar3[lVar1] - (pjVar8[lVar1] * -0x6583 >> 0xd);
        }
      }
    }
    jpc_qmfb_join_colgrp(a,height,stride,parity);
    a = a + 0x10;
    pjVar22 = pjVar22 + 0x10;
    pjVar13 = pjVar13 + 0x10;
    pjVar21 = pjVar21 + 0x10;
    local_70 = local_70 + 0x10;
    pjVar4 = pjVar4 + 0x10;
  }
  if ((width & 0xfffffff0U) != width) {
    uVar16 = width & 0xf;
    if (1 < (uint)height) {
      uVar10 = (parity ^ 1) + height >> 1;
      pjVar4 = a;
      uVar18 = uVar10;
      while (bVar23 = uVar18 != 0, uVar18 = uVar18 - 1, bVar23) {
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          pjVar4[lVar1] = pjVar4[lVar1] * 0x275d >> 0xd;
        }
        pjVar4 = pjVar4 + (uint)stride;
      }
      pjVar4 = a + uVar10 * stride;
      pjVar3 = pjVar13;
      iVar5 = height - uVar10;
      while (bVar23 = iVar5 != 0, iVar5 = iVar5 + -1, bVar23) {
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          pjVar3[lVar1] = pjVar3[lVar1] * 0x3406 >> 0xd;
        }
        pjVar3 = pjVar3 + (uint)stride;
      }
      pjVar3 = a;
      if (parity == 0) {
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          a[lVar1] = a[lVar1] - (a[uVar11 + lVar1] * 0x1c62 >> 0xd);
        }
        pjVar3 = a + (uint)stride;
      }
      iVar15 = (uVar10 - uVar9) - uVar19;
      pjVar8 = pjVar13;
      pjVar12 = pjVar21;
      iVar5 = iVar15;
      while( true ) {
        uVar9 = ystart & 1;
        bVar23 = iVar5 == 0;
        iVar5 = iVar5 + -1;
        if (bVar23) break;
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          pjVar3[lVar1] = pjVar3[lVar1] - ((pjVar12[lVar1] + pjVar8[lVar1]) * 0xe31 >> 0xd);
        }
        pjVar3 = pjVar3 + (uint)stride;
        pjVar8 = pjVar8 + (uint)stride;
        pjVar12 = pjVar12 + (uint)stride;
      }
      if (local_a8 != uVar9) {
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          pjVar3[lVar1] = pjVar3[lVar1] - (pjVar8[lVar1] * 0x1c62 >> 0xd);
        }
      }
      pjVar3 = pjVar4;
      if (uVar9 != 0) {
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          a[uVar11 + lVar1] = a[uVar11 + lVar1] - (a[lVar1] * 0x3881 >> 0xd);
        }
        pjVar3 = pjVar4 + (uint)stride;
      }
      iVar20 = ((height - uVar10) - uVar9) - uVar14;
      pjVar8 = a;
      pjVar12 = pjVar22;
      iVar5 = iVar20;
      while( true ) {
        uVar14 = ystart & 1;
        bVar23 = iVar5 == 0;
        iVar5 = iVar5 + -1;
        if (bVar23) break;
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          pjVar3[lVar1] = pjVar3[lVar1] - ((pjVar12[lVar1] + pjVar8[lVar1]) * 0x1c40 >> 0xd);
        }
        pjVar8 = pjVar8 + (uint)stride;
        pjVar3 = pjVar3 + (uint)stride;
        pjVar12 = pjVar12 + (uint)stride;
      }
      if (local_a8 == uVar14) {
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          pjVar3[lVar1] = pjVar3[lVar1] - (pjVar8[lVar1] * 0x3881 >> 0xd);
        }
      }
      pjVar3 = a;
      if (uVar14 == 0) {
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          a[lVar1] = a[lVar1] - (a[uVar11 + lVar1] * -0x364 >> 0xd);
        }
        pjVar3 = a + (uint)stride;
      }
      while (bVar23 = iVar15 != 0, iVar15 = iVar15 + -1, bVar23) {
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          pjVar3[lVar1] = pjVar3[lVar1] - ((pjVar21[lVar1] + pjVar13[lVar1]) * -0x1b2 >> 0xd);
        }
        pjVar3 = pjVar3 + (uint)stride;
        pjVar13 = pjVar13 + (uint)stride;
        pjVar21 = pjVar21 + (uint)stride;
      }
      if (local_a8 != uVar14) {
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          pjVar3[lVar1] = pjVar3[lVar1] - (pjVar13[lVar1] * -0x364 >> 0xd);
        }
      }
      pjVar13 = a;
      if (uVar14 != 0) {
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          a[(ulong)(uVar10 * stride) + lVar1] =
               a[(ulong)(uVar10 * stride) + lVar1] - (a[lVar1] * -0x6583 >> 0xd);
        }
        pjVar4 = pjVar4 + (uint)stride;
      }
      while (bVar23 = iVar20 != 0, iVar20 = iVar20 + -1, bVar23) {
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          pjVar4[lVar1] = pjVar4[lVar1] - ((pjVar22[lVar1] + pjVar13[lVar1]) * -0x32c1 >> 0xd);
        }
        pjVar4 = pjVar4 + (uint)stride;
        pjVar22 = pjVar22 + (uint)stride;
        pjVar13 = pjVar13 + (uint)stride;
      }
      if (local_a8 == uVar14) {
        for (lVar1 = 0; uVar16 != (uint)lVar1; lVar1 = lVar1 + 1) {
          pjVar4[lVar1] = pjVar4[lVar1] - (pjVar13[lVar1] * -0x6583 >> 0xd);
        }
      }
    }
    jpc_qmfb_join_colres(a,height,uVar16,stride,ystart & 1);
  }
  return 0;
}

Assistant:

int jpc_ns_synthesize(jpc_fix_t *a, int xstart, int ystart, int width,
  int height, int stride)
{

	const unsigned numrows = height;
	const unsigned numcols = width;
	const unsigned rowparity = ystart & 1;
	const unsigned colparity = xstart & 1;
	jpc_fix_t *startptr;

	startptr = &a[0];
	for (unsigned i = 0; i < numrows; ++i) {
		jpc_ns_invlift_row(startptr, numcols, colparity);
		jpc_qmfb_join_row(startptr, numcols, colparity);
		startptr += stride;
	}

	const unsigned maxcols = (numcols / JPC_QMFB_COLGRPSIZE) * JPC_QMFB_COLGRPSIZE;
	startptr = &a[0];
	for (unsigned i = 0; i < maxcols; i += JPC_QMFB_COLGRPSIZE) {
		jpc_ns_invlift_colgrp(startptr, numrows, stride, rowparity);
		jpc_qmfb_join_colgrp(startptr, numrows, stride, rowparity);
		startptr += JPC_QMFB_COLGRPSIZE;
	}
	if (maxcols < numcols) {
		jpc_ns_invlift_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
		jpc_qmfb_join_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
	}

	return 0;

}